

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataCollectionSegment::FetchChunk
          (ColumnDataCollectionSegment *this,idx_t chunk_idx,DataChunk *result)

{
  vector<unsigned_long,_true> column_ids;
  unsigned_long local_50;
  vector<unsigned_long,_true> local_48;
  
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_50 = 0;
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,
                   (iterator)
                   local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        *local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_50;
        local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_50 = local_50 + 1;
    } while (local_50 <
             (ulong)(((long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  FetchChunk(this,chunk_idx,result,&local_48);
  if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColumnDataCollectionSegment::FetchChunk(idx_t chunk_idx, DataChunk &result) {
	vector<column_t> column_ids;
	column_ids.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		column_ids.push_back(i);
	}
	FetchChunk(chunk_idx, result, column_ids);
}